

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *pIVar1;
  pointer ppEVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  TimeInMillis TVar6;
  UnitTestImpl *pUVar7;
  TestSuite *pTVar8;
  TestPartResult *pTVar9;
  int i;
  uint uVar10;
  int test_index;
  TestResult *this_00;
  pointer ppEVar11;
  TestEventRepeater *pTVar12;
  byte bVar13;
  int j;
  int i_00;
  int iVar14;
  ulong uVar15;
  allocator local_7d;
  uint local_7c;
  TestEventRepeater *local_78;
  uint local_70;
  int local_6c;
  vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *local_68;
  ulong local_60;
  Timer timer;
  char *local_50 [4];
  
  bVar3 = GTestIsInitialized();
  bVar13 = 1;
  if (g_help_flag == '\0') {
    PostFlagParsingInit(this);
    WriteToShardStatusFileIfNeeded();
    pIVar1 = (this->internal_run_death_test_flag_)._M_t.
             super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
             ._M_t.
             super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
             .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>.
             _M_head_impl;
    bVar4 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",
                        pIVar1 != (InternalRunDeathTestFlag *)0x0);
    local_6c = FilterTests(this,(uint)!bVar4);
    if (FLAGS_gtest_list_tests == '\x01') {
      ListTestsMatchingFilter(this);
    }
    else {
      iVar5 = GetRandomSeedFromFlag(FLAGS_gtest_random_seed);
      this->random_seed_ = iVar5;
      pTVar12 = (this->listeners_).repeater_;
      TVar6 = GetTimeInMillis();
      this->start_timestamp_ = TVar6;
      (*(pTVar12->super_TestEventListener)._vptr_TestEventListener[2])(pTVar12,this->parent_);
      bVar13 = FLAGS_gtest_recreate_environments_when_repeating;
      local_60 = 1;
      if (pIVar1 == (InternalRunDeathTestFlag *)0x0) {
        local_60 = (ulong)FLAGS_gtest_repeat;
      }
      iVar5 = (int)local_60;
      local_68 = &this->environments_;
      local_70 = iVar5 - 1;
      uVar10 = 0;
      uVar15 = 0;
      local_78 = pTVar12;
LAB_0011bd94:
      pTVar12 = local_78;
      if (uVar10 != (uint)local_60 || (int)(uint)local_60 < 0) {
        ClearNonAdHocTestResult(this);
        timer.start_.__d.__r = (time_point)std::chrono::_V2::steady_clock::now();
        if (0 < local_6c) {
          if (FLAGS_gtest_shuffle == '\x01') {
            (this->random_).state_ = this->random_seed_;
            ShuffleTests(this);
          }
          (*(pTVar12->super_TestEventListener)._vptr_TestEventListener[3])
                    (pTVar12,this->parent_,(ulong)uVar10);
          if (uVar10 == 0 || (iVar5 < 0 || (bVar13 & 1) != 0)) {
            (*(pTVar12->super_TestEventListener)._vptr_TestEventListener[4])(pTVar12,this->parent_);
            ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                      (local_68,SetUpEnvironment);
            (*(pTVar12->super_TestEventListener)._vptr_TestEventListener[5])(pTVar12,this->parent_);
          }
          bVar4 = Test::IsSkipped();
          local_7c = (uint)uVar15;
          if (bVar4) {
            pUVar7 = GetUnitTestImpl();
            if (pUVar7->current_test_info_ == (TestInfo *)0x0) {
              if (pUVar7->current_test_suite_ == (TestSuite *)0x0) {
                this_00 = &pUVar7->ad_hoc_test_result_;
              }
              else {
                this_00 = &pUVar7->current_test_suite_->ad_hoc_test_result_;
              }
            }
            else {
              this_00 = &pUVar7->current_test_info_->result_;
            }
            for (iVar14 = 0;
                iVar14 < (int)(((long)(this_00->test_part_results_).
                                      super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this_00->test_part_results_).
                                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x70);
                iVar14 = iVar14 + 1) {
              pTVar9 = TestResult::GetTestPartResult(this_00,iVar14);
              if (pTVar9->type_ == kSkip) {
                std::__cxx11::string::string
                          ((string *)local_50,(pTVar9->message_)._M_dataplus._M_p,&local_7d);
                puts(local_50[0]);
                std::__cxx11::string::~string((string *)local_50);
              }
            }
            fflush(_stdout);
          }
          else {
            bVar4 = Test::HasFatalFailure();
            if (bVar4) {
              bVar4 = Test::HasFatalFailure();
              if (bVar4) {
                for (iVar14 = 0;
                    iVar14 < (int)((ulong)((long)(this->test_suites_).
                                                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->test_suites_).
                                                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
                    iVar14 = iVar14 + 1) {
                  pTVar8 = GetMutableSuiteCase(this,iVar14);
                  TestSuite::Skip(pTVar8);
                }
              }
            }
            else {
              iVar14 = 1;
              for (i_00 = 0;
                  i_00 < (int)((ulong)((long)(this->test_suites_).
                                             super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->test_suites_).
                                            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
                  i_00 = i_00 + 1) {
                pTVar8 = GetMutableSuiteCase(this,i_00);
                TestSuite::Run(pTVar8);
                if (FLAGS_gtest_fail_fast == '\x01') {
                  pTVar8 = GetMutableSuiteCase(this,i_00);
                  bVar4 = TestSuite::Failed(pTVar8);
                  if (bVar4) goto LAB_0011bf2d;
                }
                iVar14 = iVar14 + 1;
              }
            }
          }
          goto LAB_0011bfcd;
        }
        (*(pTVar12->super_TestEventListener)._vptr_TestEventListener[3])
                  (pTVar12,this->parent_,(ulong)uVar10);
        goto LAB_0011c02f;
      }
      (*(local_78->super_TestEventListener)._vptr_TestEventListener[0x11])(local_78,this->parent_);
      if (!bVar3) {
        ColoredPrintf(kRed,
                      "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                     );
      }
      bVar13 = (byte)uVar15 ^ 1;
    }
  }
  return (bool)(bVar13 & 1);
LAB_0011bf2d:
  for (; iVar14 < (int)((ulong)((long)(this->test_suites_).
                                      super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->test_suites_).
                                     super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
      iVar14 = iVar14 + 1) {
    pTVar8 = GetMutableSuiteCase(this,iVar14);
    TestSuite::Skip(pTVar8);
  }
LAB_0011bfcd:
  uVar15 = (ulong)local_7c;
  pTVar12 = local_78;
  if (uVar10 == local_70 || (iVar5 < 0 || (bVar13 & 1) != 0)) {
    (*(local_78->super_TestEventListener)._vptr_TestEventListener[0xe])(local_78,this->parent_);
    ppEVar2 = (this->environments_).
              super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (ppEVar11 = (this->environments_).
                    super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pTVar12 = local_78,
        ppEVar11 != ppEVar2; ppEVar11 = ppEVar11 + -1) {
      (**(code **)(*(long *)ppEVar11[-1] + 0x18))();
    }
    (*(local_78->super_TestEventListener)._vptr_TestEventListener[0xf])(local_78,this->parent_);
    uVar15 = (ulong)local_7c;
  }
LAB_0011c02f:
  TVar6 = Timer::Elapsed(&timer);
  this->elapsed_time_ = TVar6;
  (*(pTVar12->super_TestEventListener)._vptr_TestEventListener[0x10])
            (pTVar12,this->parent_,(ulong)uVar10);
  bVar4 = Passed(this);
  UnshuffleTests(this);
  if (FLAGS_gtest_shuffle == '\x01') {
    iVar14 = GetNextRandomSeed(this->random_seed_);
    this->random_seed_ = iVar14;
  }
  uVar15 = CONCAT71((int7)(uVar15 >> 8),(byte)uVar15 | !bVar4);
  uVar10 = uVar10 + 1;
  goto LAB_0011bd94;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True if and only if Google Test is initialized before RUN_ALL_TESTS() is
  // called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag) return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

#if GTEST_HAS_FILE_SYSTEM
  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();
#endif  // GTEST_HAS_FILE_SYSTEM

  // True if and only if we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#ifdef GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test = (internal_run_death_test_flag_ != nullptr);
#if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
#endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run =
      FilterTests(should_shard ? HONOR_SHARDING_PROTOCOL
                               : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG_GET(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GetRandomSeedFromFlag(GTEST_FLAG_GET(random_seed));

  // True if and only if at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG_GET(repeat);

  // Repeats forever if the repeat count is negative.
  const bool gtest_repeat_forever = repeat < 0;

  // Should test environments be set up and torn down for each repeat, or only
  // set up on the first and torn down on the last iteration? If there is no
  // "last" iteration because the tests will repeat forever, always recreate the
  // environments to avoid leaks in case one of the environments is using
  // resources that are external to this process. Without this check there would
  // be no way to clean up those external resources automatically.
  const bool recreate_environments_when_repeating =
      GTEST_FLAG_GET(recreate_environments_when_repeating) ||
      gtest_repeat_forever;

  for (int i = 0; gtest_repeat_forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    Timer timer;

    // Shuffles test suites and tests if requested.
    if (has_tests_to_run && GTEST_FLAG_GET(shuffle)) {
      random()->Reseed(static_cast<uint32_t>(random_seed_));
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test suite if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand. If test environments aren't
      // recreated for each iteration, only do so on the first iteration.
      if (i == 0 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsSetUpStart(*parent_);
        ForEach(environments_, SetUpEnvironment);
        repeater->OnEnvironmentsSetUpEnd(*parent_);
      }

      // Runs the tests only if there was no fatal failure or skip triggered
      // during global set-up.
      if (Test::IsSkipped()) {
        // Emit diagnostics when global set-up calls skip, as it will not be
        // emitted by default.
        TestResult& test_result =
            *internal::GetUnitTestImpl()->current_test_result();
        for (int j = 0; j < test_result.total_part_count(); ++j) {
          const TestPartResult& test_part_result =
              test_result.GetTestPartResult(j);
          if (test_part_result.type() == TestPartResult::kSkip) {
            const std::string& result = test_part_result.message();
            printf("%s\n", result.c_str());
          }
        }
        fflush(stdout);
      } else if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Run();
          if (GTEST_FLAG_GET(fail_fast) &&
              GetMutableSuiteCase(test_index)->Failed()) {
            for (int j = test_index + 1; j < total_test_suite_count(); j++) {
              GetMutableSuiteCase(j)->Skip();
            }
            break;
          }
        }
      } else if (Test::HasFatalFailure()) {
        // If there was a fatal failure during the global setup then we know we
        // aren't going to run any tests. Explicitly mark all of the tests as
        // skipped to make this obvious in the output.
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Skip();
        }
      }

      // Tears down all environments in reverse order afterwards. If test
      // environments aren't recreated for each iteration, only do so on the
      // last iteration.
      if (i == repeat - 1 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsTearDownStart(*parent_);
        std::for_each(environments_.rbegin(), environments_.rend(),
                      TearDownEnvironment);
        repeater->OnEnvironmentsTearDownEnd(*parent_);
      }
    }

    elapsed_time_ = timer.Elapsed();

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG_GET(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        GTestColor::kRed,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
  }

  return !failed;
}